

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O3

void Imf_3_2::loadFlatTiledImage(string *fileName,Header *hdr,FlatImage *img)

{
  uint uVar1;
  char *pcVar2;
  Header *pHVar3;
  int iVar4;
  LevelMode LVar5;
  int iVar6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  undefined8 uVar10;
  long lVar11;
  int y;
  int x;
  TiledInputFile in;
  allocator<char> local_69;
  TiledInputFile local_68 [16];
  Header *local_58;
  string local_50;
  
  pcVar2 = (fileName->_M_dataplus)._M_p;
  local_58 = hdr;
  iVar4 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledInputFile::TiledInputFile(local_68,pcVar2,iVar4);
  Imf_3_2::TiledInputFile::header();
  Imf_3_2::Header::channels();
  Image::clearChannels(&img->super_Image);
  p_Var8 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
  while( true ) {
    p_Var9 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var8 == p_Var9) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,(char *)(p_Var8 + 1),&local_69);
    Image::insertChannel(&img->super_Image,&local_50,(Channel *)(p_Var8 + 9));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  }
  Imf_3_2::TiledInputFile::header();
  uVar10 = Imf_3_2::Header::dataWindow();
  Imf_3_2::TiledInputFile::header();
  lVar11 = Imf_3_2::Header::tileDescription();
  uVar1 = *(uint *)(lVar11 + 8);
  Imf_3_2::TiledInputFile::header();
  Imf_3_2::Header::tileDescription();
  (*(img->super_Image)._vptr_Image[2])(img,uVar10,(ulong)uVar1);
  LVar5 = Image::levelMode(&img->super_Image);
  if (LVar5 == ONE_LEVEL) {
    anon_unknown_21::loadLevel(local_68,img,0,0);
  }
  else if (LVar5 == MIPMAP_LEVELS) {
    iVar4 = 0;
    while( true ) {
      iVar6 = Image::numLevels(&img->super_Image);
      if (iVar6 <= iVar4) break;
      anon_unknown_21::loadLevel(local_68,img,iVar4,iVar4);
      iVar4 = iVar4 + 1;
    }
  }
  else if (LVar5 == RIPMAP_LEVELS) {
    iVar4 = 0;
    while( true ) {
      iVar6 = Image::numYLevels(&img->super_Image);
      if (iVar6 <= iVar4) break;
      iVar6 = 0;
      while( true ) {
        iVar7 = Image::numXLevels(&img->super_Image);
        if (iVar7 <= iVar6) break;
        anon_unknown_21::loadLevel(local_68,img,iVar6,iVar4);
        iVar6 = iVar6 + 1;
      }
      iVar4 = iVar4 + 1;
    }
  }
  Imf_3_2::TiledInputFile::header();
  p_Var8 = (_Rb_tree_node_base *)Imf_3_2::Header::begin();
  pHVar3 = local_58;
  while( true ) {
    Imf_3_2::TiledInputFile::header();
    p_Var9 = (_Rb_tree_node_base *)Imf_3_2::Header::end();
    if (p_Var8 == p_Var9) break;
    Imf_3_2::Header::insert((char *)pHVar3,(Attribute *)(p_Var8 + 1));
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  }
  Imf_3_2::TiledInputFile::~TiledInputFile(local_68);
  return;
}

Assistant:

void
loadFlatTiledImage (const string& fileName, Header& hdr, FlatImage& img)
{
    TiledInputFile in (fileName.c_str ());

    const ChannelList& cl = in.header ().channels ();

    img.clearChannels ();

    for (ChannelList::ConstIterator i = cl.begin (); i != cl.end (); ++i)
        img.insertChannel (i.name (), i.channel ());

    img.resize (
        in.header ().dataWindow (),
        in.header ().tileDescription ().mode,
        in.header ().tileDescription ().roundingMode);

    switch (img.levelMode ())
    {
        case ONE_LEVEL: loadLevel (in, img, 0, 0); break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < img.numLevels (); ++x)
                loadLevel (in, img, x, x);

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < img.numYLevels (); ++y)
                for (int x = 0; x < img.numXLevels (); ++x)
                    loadLevel (in, img, x, y);

            break;

        default: assert (false);
    }

    for (Header::ConstIterator i = in.header ().begin ();
         i != in.header ().end ();
         ++i)
    {
        hdr.insert (i.name (), i.attribute ());
    }
}